

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode findprotocol(Curl_easy *data,connectdata *conn,char *protostr)

{
  Curl_handler *pCVar1;
  char *pcVar2;
  char *pcVar3;
  Curl_handler *p;
  char *protostr_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pCVar1 = Curl_get_scheme_handler(protostr);
  if (((pCVar1 == (Curl_handler *)0x0) || (((data->set).allowed_protocols & pCVar1->protocol) == 0))
     || (((*(uint *)&(data->state).field_0x774 >> 1 & 1) != 0 &&
         (((data->set).redir_protocols & pCVar1->protocol) == 0)))) {
    pcVar2 = "not supported";
    if (pCVar1 != (Curl_handler *)0x0) {
      pcVar2 = "disabled";
    }
    pcVar3 = "";
    if ((*(uint *)&(data->state).field_0x774 >> 1 & 1) != 0) {
      pcVar3 = " (in redirect)";
    }
    Curl_failf(data,"Protocol \"%s\" %s%s",protostr,pcVar2,pcVar3);
    data_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    conn->given = pCVar1;
    conn->handler = pCVar1;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode findprotocol(struct Curl_easy *data,
                             struct connectdata *conn,
                             const char *protostr)
{
  const struct Curl_handler *p = Curl_get_scheme_handler(protostr);

  if(p && /* Protocol found in table. Check if allowed */
     (data->set.allowed_protocols & p->protocol)) {

    /* it is allowed for "normal" request, now do an extra check if this is
       the result of a redirect */
    if(data->state.this_is_a_follow &&
       !(data->set.redir_protocols & p->protocol))
      /* nope, get out */
      ;
    else {
      /* Perform setup complement if some. */
      conn->handler = conn->given = p;
      /* 'port' and 'remote_port' are set in setup_connection_internals() */
      return CURLE_OK;
    }
  }

  /* The protocol was not found in the table, but we do not have to assign it
     to anything since it is already assigned to a dummy-struct in the
     create_conn() function when the connectdata struct is allocated. */
  failf(data, "Protocol \"%s\" %s%s", protostr,
        p ? "disabled" : "not supported",
        data->state.this_is_a_follow ? " (in redirect)":"");

  return CURLE_UNSUPPORTED_PROTOCOL;
}